

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

void __thiscall cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger)

{
  cmConnection *conn;
  cmServerBufferStrategy *this_00;
  cmDebugger *debugger_local;
  cmDebugServerJson *this_local;
  
  conn = (cmConnection *)operator_new(0x48);
  this_00 = (cmServerBufferStrategy *)operator_new(0x28);
  (this_00->RequestBuffer)._M_string_length = 0;
  (this_00->RequestBuffer).field_2._M_allocated_capacity = 0;
  (this_00->super_cmConnectionBufferStrategy)._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined8 *)&this_00->RequestBuffer = 0;
  *(undefined8 *)((long)&(this_00->RequestBuffer).field_2 + 8) = 0;
  cmServerBufferStrategy::cmServerBufferStrategy(this_00);
  cmStdIoConnection::cmStdIoConnection
            ((cmStdIoConnection *)conn,(cmConnectionBufferStrategy *)this_00);
  cmDebugServerJson(this,debugger,conn);
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger)
  : cmDebugServerJson(debugger,
                      new cmStdIoConnection(new cmServerBufferStrategy()))
{
}